

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O2

void cppwinrt::write_open_file_guard(writer *w,string_view *file_name,char impl)

{
  size_t sVar1;
  size_t sVar2;
  string mangled_name;
  string_view local_40;
  
  write_include_guard(w);
  mangled_name._M_dataplus._M_p = (pointer)&mangled_name.field_2;
  mangled_name._M_string_length = 0;
  mangled_name.field_2._M_local_buf[0] = '\0';
  sVar1 = file_name->_M_len;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::string::push_back((char)&mangled_name);
  }
  if (impl != '\0') {
    std::__cxx11::string::push_back((char)&mangled_name);
    std::__cxx11::string::push_back((char)&mangled_name);
  }
  local_40._M_len = 0x24;
  local_40._M_str = "#ifndef WINRT_%_H\n#define WINRT_%_H\n";
  writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string,std::__cxx11::string>
            (&w->super_writer_base<cppwinrt::writer>,&local_40,&mangled_name,&mangled_name);
  std::__cxx11::string::~string((string *)&mangled_name);
  return;
}

Assistant:

static void write_open_file_guard(writer& w, std::string_view const& file_name, char impl = 0)
    {
        write_include_guard(w);
            
        std::string mangled_name;

        for (auto&& c : file_name)
        {
            mangled_name += c == '.' ? '_' : c;
        }

        if (impl)
        {
            mangled_name += '_';
            mangled_name += impl;
        }

        auto format = R"(#ifndef WINRT_%_H
#define WINRT_%_H
)";

        w.write(format, mangled_name, mangled_name);
    }